

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O0

bool OpenMD::isType<double>(string *str)

{
  byte bVar1;
  long *plVar2;
  string *in_RDI;
  bool ret;
  istringstream iss;
  double result;
  istringstream local_190 [384];
  double local_10 [2];
  
  std::__cxx11::istringstream::istringstream(local_190,in_RDI,_S_in);
  plVar2 = (long *)std::istream::operator>>(local_190,local_10);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  std::__cxx11::istringstream::~istringstream(local_190);
  return (bVar1 & 1) == 0;
}

Assistant:

bool isType(const std::string& str) {
    T result;
    std::istringstream iss(str);
    bool ret = true;
    if (!(iss >> result)) { ret = false; }
    return ret;
  }